

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O0

void __thiscall Client::handleGetUserPostsRequest(Client *this,GetUserPostsRequest *request)

{
  pointer *this_00;
  CommunicationStack *pCVar1;
  bool bVar2;
  int userId;
  reference pPVar3;
  reference pvVar4;
  string *val;
  Event EVar5;
  bool local_2f1;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_2f0;
  GetUserPostsResponse local_2e0;
  undefined1 local_2c8 [36];
  int local_2a4;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_2a0;
  undefined1 local_290 [8];
  Post post;
  iterator __end1;
  iterator __begin1;
  vector<Post,_std::allocator<Post>_> *__range1;
  json j_array;
  json j_post;
  DatabaseException *e;
  string local_1d0 [32];
  User local_1b0;
  undefined1 local_128 [8];
  User temp;
  vector<Post,_std::allocator<Post>_> posts;
  GetUserPostsResponse local_78;
  GetUserPostsResponse local_60;
  byte local_39;
  string local_38 [32];
  GetUserPostsRequest *local_18;
  GetUserPostsRequest *request_local;
  Client *this_local;
  
  local_39 = 0;
  local_2f1 = true;
  local_18 = request;
  request_local = (GetUserPostsRequest *)this;
  if (this->user != (User *)0x0) {
    std::__cxx11::string::string(local_38,(string *)request);
    local_39 = 1;
    local_2f1 = Database::containsForbiddenChars((string *)local_38);
  }
  if ((local_39 & 1) != 0) {
    std::__cxx11::string::~string(local_38);
  }
  if (local_2f1 == false) {
    std::vector<Post,_std::allocator<Post>_>::vector
              ((vector<Post,_std::allocator<Post>_> *)&temp.field_0x80);
    User::User((User *)local_128);
    std::__cxx11::string::string(local_1d0,(string *)request);
    Database::getUserByUsername(&local_1b0,&server.database,(string *)local_1d0);
    User::operator=((User *)local_128,&local_1b0);
    User::~User(&local_1b0);
    std::__cxx11::string::~string(local_1d0);
    userId = User::getId((User *)local_128);
    Database::getPostsByUserId((vector<Post,_std::allocator<Post>_> *)&e,&server.database,userId);
    std::vector<Post,_std::allocator<Post>_>::operator=
              ((vector<Post,_std::allocator<Post>_> *)&temp.field_0x80,
               (vector<Post,_std::allocator<Post>_> *)&e);
    std::vector<Post,_std::allocator<Post>_>::~vector((vector<Post,_std::allocator<Post>_> *)&e);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)&j_array.m_value,(nullptr_t)0x0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)&__range1,(nullptr_t)0x0);
    __end1 = std::vector<Post,_std::allocator<Post>_>::begin
                       ((vector<Post,_std::allocator<Post>_> *)&temp.field_0x80);
    post._32_8_ = std::vector<Post,_std::allocator<Post>_>::end
                            ((vector<Post,_std::allocator<Post>_> *)&temp.field_0x80);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<Post_*,_std::vector<Post,_std::allocator<Post>_>_>
                                       *)&post.field_0x20), bVar2) {
      pPVar3 = __gnu_cxx::__normal_iterator<Post_*,_std::vector<Post,_std::allocator<Post>_>_>::
               operator*(&__end1);
      Post::Post((Post *)local_290,pPVar3);
      local_2a4 = Post::getId((Post *)local_290);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json<int,_int,_0>(&local_2a0,&local_2a4);
      pvVar4 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)&j_array.m_value.boolean,"id");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::operator=(pvVar4,&local_2a0);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(&local_2a0);
      val = Post::getContent_abi_cxx11_((Post *)local_290);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)(local_2c8 + 0x10),val);
      pvVar4 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)&j_array.m_value.boolean,"content");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::operator=(pvVar4,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)(local_2c8 + 0x10));
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)(local_2c8 + 0x10));
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)&__range1,
                  (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)&j_array.m_value);
      Post::~Post((Post *)local_290);
      __gnu_cxx::__normal_iterator<Post_*,_std::vector<Post,_std::allocator<Post>_>_>::operator++
                (&__end1);
    }
    pCVar1 = this->communicationStack;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json(&local_2f0,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)&__range1);
    GetUserPostsResponse::GetUserPostsResponse(&local_2e0,true,&local_2f0);
    EVar5 = GetUserPostsResponse::operator_cast_to_basic_json((GetUserPostsResponse *)local_2c8);
    (*(pCVar1->super_IONotifiable)._vptr_IONotifiable[3])(pCVar1,local_2c8,EVar5.m_value.object);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)local_2c8);
    GetUserPostsResponse::~GetUserPostsResponse(&local_2e0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&local_2f0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)&__range1);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)&j_array.m_value);
    User::~User((User *)local_128);
    std::vector<Post,_std::allocator<Post>_>::~vector
              ((vector<Post,_std::allocator<Post>_> *)&temp.field_0x80);
  }
  else {
    pCVar1 = this->communicationStack;
    this_00 = &posts.super__Vector_base<Post,_std::allocator<Post>_>._M_impl.super__Vector_impl_data
               ._M_end_of_storage;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json<const_char_(&)[1],_char[1],_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)this_00,(char (*) [1])0x1fc646);
    GetUserPostsResponse::GetUserPostsResponse(&local_78,false,(json *)this_00);
    EVar5 = GetUserPostsResponse::operator_cast_to_basic_json(&local_60);
    (*(pCVar1->super_IONotifiable)._vptr_IONotifiable[3])(pCVar1,&local_60,EVar5.m_value.object);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)&local_60);
    GetUserPostsResponse::~GetUserPostsResponse(&local_78);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)&posts.super__Vector_base<Post,_std::allocator<Post>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void Client::handleGetUserPostsRequest(GetUserPostsRequest request)
{
	if(user == nullptr || Database::containsForbiddenChars(request.username))
	{
		communicationStack->sendEvent(GetUserPostsResponse(false,""));
		return;
	}

	std::vector<Post> posts;
	User temp;

	try
	{
		temp = server.database.getUserByUsername(request.username);
		posts = server.database.getPostsByUserId(temp.getId());
	}
	catch (DatabaseException& e)
	{
		std::cout << e.what() << std::endl;
		communicationStack->sendEvent(GetUserPostsResponse(false, ""));
		return;
	}

	json j_post;
	json j_array;

	for(auto post: posts)
	{
		j_post["id"] = post.getId();
		j_post["content"] = post.getContent();
		j_array.push_back(j_post);
	}

	communicationStack->sendEvent(GetUserPostsResponse(true, j_array));
}